

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmFileCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  char *val;
  allocator local_41;
  string local_40;
  
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,command,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00688220;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 4;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  (this->Rename)._M_dataplus._M_p = (pointer)&(this->Rename).field_2;
  (this->Rename)._M_string_length = 0;
  (this->Rename).field_2._M_local_buf[0] = '\0';
  (this->Manifest)._M_dataplus._M_p = (pointer)&(this->Manifest).field_2;
  (this->Manifest)._M_string_length = 0;
  (this->Manifest).field_2._M_local_buf[0] = '\0';
  (this->super_cmFileCopier).UseSourcePermissions = false;
  val = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS");
  bVar1 = cmSystemTools::IsOn(val);
  (this->super_cmFileCopier).Always = bVar1;
  this_00 = (this->super_cmFileCopier).Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_INSTALL_MANIFEST_FILES",&local_41);
  cmMakefile::GetSafeDefinition(this_00,&local_40);
  std::__cxx11::string::assign((char *)&this->Manifest);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

cmFileInstaller(cmFileCommand* command):
    cmFileCopier(command, "INSTALL"),
    InstallType(cmInstallType_FILES),
    Optional(false),
    MessageAlways(false),
    MessageLazy(false),
    MessageNever(false),
    DestDirLength(0)
    {
    // Installation does not use source permissions by default.
    this->UseSourcePermissions = false;
    // Check whether to copy files always or only if they have changed.
    this->Always =
      cmSystemTools::IsOn(cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS"));
    // Get the current manifest.
    this->Manifest =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
    }